

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

int ParseExpUnair(char **p,aint *nval)

{
  bool bVar1;
  int iVar2;
  int local_40;
  uint local_3c;
  int oper;
  aint right;
  int hasParentheses;
  int existEval;
  int norelParseRes;
  bool oldAreLabelsOffset;
  char *oldP;
  aint *nval_local;
  char **p_local;
  
  oldP = (char *)nval;
  nval_local = (aint *)p;
  SkipBlanks(p);
  _norelParseRes = *(undefined8 *)nval_local;
  iVar2 = cmphstr((char **)nval_local,"norel",true);
  if (iVar2 != 0) {
    existEval._3_1_ = Relocation::areLabelsOffset & 1;
    Relocation::areLabelsOffset = 0;
    iVar2 = ParseExpPrim((char **)nval_local,(aint *)oldP);
    Relocation::areLabelsOffset = existEval._3_1_ & 1;
    if (iVar2 != 0) {
      return 1;
    }
    *(undefined8 *)nval_local = _norelParseRes;
    hasParentheses = 0;
  }
  iVar2 = cmphstr((char **)nval_local,"exist",true);
  if (iVar2 != 0) {
    right = 0;
    oper = need((char **)nval_local,'(');
    if ((oper != 0) || (bVar1 = isLabelStart(*(char **)nval_local,true), bVar1)) {
      bVar1 = LabelExist((char **)nval_local,(aint *)oldP);
      right = (aint)bVar1;
    }
    if ((right != 0) && (oper != 0)) {
      right = need((char **)nval_local,')');
    }
    if (right != 0) {
      return 1;
    }
    *(undefined8 *)nval_local = _norelParseRes;
  }
  local_40 = need((char **)nval_local,"! ~ + - ");
  if (((local_40 == 0) &&
      (local_40 = needa((char **)nval_local,"not",0x21,"low",0x6c,"high",0x68,true), local_40 == 0))
     && (local_40 = needa((char **)nval_local,"abs",0x61,(char *)0x0,0,(char *)0x0,0,true),
        local_40 == 0)) {
    p_local._4_4_ = ParseExpPrim((char **)nval_local,(aint *)oldP);
  }
  else {
    if (local_40 == 0x21) {
      iVar2 = ParseExpUnair((char **)nval_local,(aint *)&local_3c);
      if (iVar2 == 0) {
        return 0;
      }
      *(uint *)oldP = -(uint)((local_3c != 0 ^ 0xffU) & 1);
    }
    else if (local_40 == 0x2b) {
      iVar2 = ParseExpUnair((char **)nval_local,(aint *)&local_3c);
      if (iVar2 == 0) {
        return 0;
      }
      *(uint *)oldP = local_3c;
    }
    else if (local_40 == 0x2d) {
      iVar2 = ParseExpUnair((char **)nval_local,(aint *)&local_3c);
      if (iVar2 == 0) {
        return 0;
      }
      *(uint *)oldP = (local_3c ^ 0xffffffff) + 1;
    }
    else if (local_40 == 0x61) {
      iVar2 = ParseExpUnair((char **)nval_local,(aint *)&local_3c);
      if (iVar2 == 0) {
        return 0;
      }
      if ((int)local_3c < 1) {
        local_3c = -local_3c;
      }
      *(uint *)oldP = local_3c;
    }
    else if (local_40 == 0x68) {
      iVar2 = ParseExpUnair((char **)nval_local,(aint *)&local_3c);
      if (iVar2 == 0) {
        return 0;
      }
      *(uint *)oldP = (int)local_3c >> 8 & 0xff;
    }
    else if (local_40 == 0x6c) {
      iVar2 = ParseExpUnair((char **)nval_local,(aint *)&local_3c);
      if (iVar2 == 0) {
        return 0;
      }
      *(uint *)oldP = local_3c & 0xff;
    }
    else if (local_40 == 0x7e) {
      iVar2 = ParseExpUnair((char **)nval_local,(aint *)&local_3c);
      if (iVar2 == 0) {
        return 0;
      }
      *(uint *)oldP = local_3c ^ 0xffffffff;
    }
    else {
      Error("internal error",(char *)0x0,FATAL);
    }
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

static int ParseExpUnair(char*& p, aint& nval) {
	SkipBlanks(p);
	char* oldP = p;
	if (cmphstr(p, "norel", true)) {
		// switch off alternative relocation evaluation for the following part of expression
		const bool oldAreLabelsOffset = Relocation::areLabelsOffset;
		Relocation::areLabelsOffset = false;
		int norelParseRes = ParseExpPrim(p, nval);			// higher priority than other unary
		Relocation::areLabelsOffset = oldAreLabelsOffset;	// restore alternative evaluation
		if (norelParseRes) return 1;
		// "norel" operator didn't parse successfully, try to ignore it (will treat it as label)
		p = oldP;
	}
	if (cmphstr(p, "exist", true)) {
		int existEval = 0, hasParentheses = need(p, '(');
		if (hasParentheses || isLabelStart(p)) {
			existEval = LabelExist(p, nval);
		}
		if (existEval && hasParentheses) {
			existEval = need(p, ')');						// check closing parenthesis
		}
		if (existEval) return 1;
		p = oldP;
	}
	aint right;
	int oper;
	if ((oper = need(p, "! ~ + - ")) || \
		(oper = needa(p, "not", '!', "low", 'l', "high", 'h', true)) || \
		(oper = needa(p, "abs", 'a', nullptr, 0, nullptr, 0, true)) ) {
		switch (oper) {
		case '!':
			if (!ParseExpUnair(p, right)) return 0;
			nval = -!right;
			break;
		case '~':
			if (!ParseExpUnair(p, right)) return 0;
			nval = ~right;
			break;
		case '+':
			if (!ParseExpUnair(p, right)) return 0;
			nval = right;
			break;
		case '-':
			if (!ParseExpUnair(p, right)) return 0;
			nval = ~right + 1;
			break;
		case 'l':
			if (!ParseExpUnair(p, right)) return 0;
			nval = right & 255;
			break;
		case 'h':
			if (!ParseExpUnair(p, right)) return 0;
			nval = (right >> 8) & 255;
			break;
		case 'a':
			if (!ParseExpUnair(p, right)) return 0;
			nval = abs(right);
			break;
		default: Error("internal error", nullptr, FATAL); break;	// unreachable
		}
		return 1;
	} else {
		return ParseExpPrim(p, nval);
	}
}